

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionResponseReliablePdu.cpp
# Opt level: O3

int __thiscall DIS::ActionResponseReliablePdu::getMarshalledSize(ActionResponseReliablePdu *this)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  pointer pVVar6;
  long lVar7;
  ulong uVar8;
  FixedDatum listElement;
  VariableDatum local_60;
  
  iVar2 = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  iVar2 = iVar2 + 0x10;
  pFVar5 = (this->_fixedDatumRecords).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_fixedDatumRecords).
      super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pFVar5) {
    lVar7 = 8;
    uVar8 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__FixedDatum_001a00a8;
      local_60._8_8_ = *(undefined8 *)((long)&pFVar5->_vptr_FixedDatum + lVar7);
      iVar3 = FixedDatum::getMarshalledSize((FixedDatum *)&local_60);
      iVar2 = iVar2 + iVar3;
      FixedDatum::~FixedDatum((FixedDatum *)&local_60);
      uVar8 = uVar8 + 1;
      pFVar5 = (this->_fixedDatumRecords).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x10;
    } while (uVar8 < (ulong)((long)(this->_fixedDatumRecords).
                                   super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar5 >> 4));
  }
  pVVar6 = (this->_variableDatumRecords).
           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_variableDatumRecords).
      super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar6) {
    lVar7 = 0x28;
    uVar8 = 0;
    do {
      local_60._vptr_VariableDatum = (_func_int **)&PTR__VariableDatum_001a1730;
      puVar1 = (uint *)((long)&pVVar6->_vptr_VariableDatum + lVar7);
      local_60._variableDatumID = puVar1[-8];
      local_60._variableDatumLength = puVar1[-7];
      std::vector<char,_std::allocator<char>_>::vector
                (&local_60._variableDatums,(vector<char,_std::allocator<char>_> *)(puVar1 + -6));
      local_60._arrayLength = *puVar1;
      uVar4 = VariableDatum::getMarshalledSize(&local_60);
      iVar2 = iVar2 + uVar4;
      VariableDatum::~VariableDatum(&local_60);
      uVar8 = uVar8 + 1;
      pVVar6 = (this->_variableDatumRecords).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x30;
    } while (uVar8 < (ulong)(((long)(this->_variableDatumRecords).
                                    super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar6 >> 4)
                            * -0x5555555555555555));
  }
  return iVar2;
}

Assistant:

int ActionResponseReliablePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 4;  // _requestID
   marshalSize = marshalSize + 4;  // _responseStatus
   marshalSize = marshalSize + 4;  // _numberOfFixedDatumRecords
   marshalSize = marshalSize + 4;  // _numberOfVariableDatumRecords

   for(unsigned long long idx=0; idx < _fixedDatumRecords.size(); idx++)
   {
        FixedDatum listElement = _fixedDatumRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _variableDatumRecords.size(); idx++)
   {
        VariableDatum listElement = _variableDatumRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}